

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyPort.hpp
# Opt level: O0

bool empty_port::impl<(empty_port::Kind)0>::check_port_impl(port_t port,char *host)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int in_ECX;
  char *pcVar2;
  int __type;
  int __type_00;
  sockaddr_in *addr;
  undefined1 local_2c [8];
  sockaddr_in remote_addr;
  SocketHolder sh;
  char *host_local;
  port_t port_local;
  
  unique0x10000107 = host;
  iVar1 = socket(2,1,0);
  SocketHolder::SocketHolder((SocketHolder *)remote_addr.sin_zero,iVar1);
  iVar1 = SocketHolder::socket((SocketHolder *)remote_addr.sin_zero,iVar1,__type,in_ECX);
  addr = (sockaddr_in *)local_2c;
  pcVar2 = stack0xffffffffffffffe8;
  fill_struct((socket_t *)CONCAT44(extraout_var,iVar1),addr,port,stack0xffffffffffffffe8);
  iVar1 = SocketHolder::socket((SocketHolder *)remote_addr.sin_zero,(int)addr,__type_00,(int)pcVar2)
  ;
  iVar1 = connect(*(int *)CONCAT44(extraout_var_00,iVar1),(sockaddr *)local_2c,0x10);
  SocketHolder::~SocketHolder((SocketHolder *)remote_addr.sin_zero);
  return iVar1 != 0;
}

Assistant:

inline bool impl<TCP>::check_port_impl(const port_t port, const char *host) {
    SocketHolder sh(socket(AF_INET, SOCK_STREAM, 0));
    sockaddr_in remote_addr;

    fill_struct(sh.socket(), remote_addr, port, host);

    if ((connect(sh.socket(), (struct sockaddr *)&remote_addr,
                 sizeof(remote_addr)))) {
        return true;
    } else {
        return false;
    }
}